

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Material.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::ParseNode_Color(AMFImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CAMFImporter_NodeElement *pCVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CAMFImporter_NodeElement_Color *this_00;
  _List_node_base *p_Var8;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  runtime_error *this_01;
  uint uVar9;
  ulong uVar10;
  char *__end;
  float fVar11;
  string an;
  string profile;
  string local_a0;
  string local_80;
  undefined1 *local_60;
  char *local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_60 = &local_50;
  local_58 = (char *)0x0;
  local_50 = 0;
  uVar5 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      iVar6 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,(char *)CONCAT44(extraout_var,iVar6),
                 (allocator<char> *)&local_80);
      iVar6 = std::__cxx11::string::compare((char *)&local_a0);
      if (iVar6 == 0) {
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])();
        pcVar4 = local_58;
        strlen((char *)CONCAT44(extraout_var_00,iVar6));
        std::__cxx11::string::_M_replace((ulong)&local_60,0,pcVar4,CONCAT44(extraout_var_00,iVar6));
      }
      else {
        Throw_IncorrectAttr(this,&local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar5 != uVar9);
  }
  this_00 = (CAMFImporter_NodeElement_Color *)operator_new(0x108);
  CAMFImporter_NodeElement_Color::CAMFImporter_NodeElement_Color(this_00,this->mNodeElement_Cur);
  std::__cxx11::string::_M_assign((string *)&this_00->Profile);
  iVar6 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar6 == '\0') {
    ParseHelper_Node_Enter(this,(CAMFImporter_NodeElement *)this_00);
    local_34 = 0;
    local_38 = 0;
    local_3c = 0;
    local_40 = 0;
    do {
      do {
        while( true ) {
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar6 == '\0') goto LAB_003f1b1a;
          iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar7 != 1) break;
          paVar2 = &local_a0.field_2;
          local_a0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"r","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar6 = std::__cxx11::string::compare((char *)&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if (iVar6 == 0) {
            if ((local_34 & 1) != 0) {
              local_a0._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"r","");
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_80,"Only one component can be defined.","");
              Throw_MoreThanOnceDefined(this,&local_a0,&local_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != paVar2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            fVar11 = XML_ReadNode_GetVal_AsFloat(this);
            (this_00->Color).r = fVar11;
            local_34 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          else {
            local_a0._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"g","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar6 = std::__cxx11::string::compare((char *)&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            if (iVar6 == 0) {
              if ((local_38 & 1) != 0) {
                local_a0._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"g","");
                local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_80,"Only one component can be defined.","");
                Throw_MoreThanOnceDefined(this,&local_a0,&local_80);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != &local_80.field_2) {
                  operator_delete(local_80._M_dataplus._M_p,
                                  local_80.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != paVar2) {
                  operator_delete(local_a0._M_dataplus._M_p,
                                  local_a0.field_2._M_allocated_capacity + 1);
                }
              }
              fVar11 = XML_ReadNode_GetVal_AsFloat(this);
              (this_00->Color).g = fVar11;
              local_38 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
            }
            else {
              local_a0._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"b","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar6 = std::__cxx11::string::compare((char *)&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != paVar2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar6 == 0) {
                if ((local_3c & 1) != 0) {
                  local_a0._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"b","");
                  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_80,"Only one component can be defined.","");
                  Throw_MoreThanOnceDefined(this,&local_a0,&local_80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_80._M_dataplus._M_p != &local_80.field_2) {
                    operator_delete(local_80._M_dataplus._M_p,
                                    local_80.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != paVar2) {
                    operator_delete(local_a0._M_dataplus._M_p,
                                    local_a0.field_2._M_allocated_capacity + 1);
                  }
                }
                fVar11 = XML_ReadNode_GetVal_AsFloat(this);
                (this_00->Color).b = fVar11;
                local_3c = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
              }
              else {
                local_a0._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"a","");
                (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar6 = std::__cxx11::string::compare((char *)&local_a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != paVar2) {
                  operator_delete(local_a0._M_dataplus._M_p,
                                  local_a0.field_2._M_allocated_capacity + 1);
                }
                if (iVar6 == 0) {
                  if ((local_40 & 1) != 0) {
                    local_a0._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"a","");
                    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_80,"Only one component can be defined.","");
                    Throw_MoreThanOnceDefined(this,&local_a0,&local_80);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_80._M_dataplus._M_p != &local_80.field_2) {
                      operator_delete(local_80._M_dataplus._M_p,
                                      local_80.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a0._M_dataplus._M_p != paVar2) {
                      operator_delete(local_a0._M_dataplus._M_p,
                                      local_a0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  fVar11 = XML_ReadNode_GetVal_AsFloat(this);
                  (this_00->Color).a = fVar11;
                  local_40 = (uint)CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
                }
                else {
                  local_a0._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"color","");
                  XML_CheckNode_SkipUnsupported(this,&local_a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != paVar2) {
                    operator_delete(local_a0._M_dataplus._M_p,
                                    local_a0.field_2._M_allocated_capacity + 1);
                  }
                }
              }
            }
          }
        }
        iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar7 != 2);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"color","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar7 = std::__cxx11::string::compare((char *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    } while (iVar7 != 0);
    if ((char)iVar6 == '\0') {
LAB_003f1b1a:
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"color","");
      Throw_CloseNotFound(this,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    ParseHelper_Node_Exit(this);
    if ((((local_34 & 1) == 0) || ((local_38 & 1) == 0)) || ((local_3c & 1) == 0)) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Not all color components are defined.","");
      std::runtime_error::runtime_error(this_01,(string *)&local_a0);
      *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_40 & 1) == 0) {
      (this_00->Color).a = 1.0;
    }
  }
  else {
    pCVar3 = this->mNodeElement_Cur;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar3->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  this_00->Composed = false;
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Color() {
    std::string profile;
    CAMFImporter_NodeElement* ne;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("profile", profile, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Color(mNodeElement_Cur);

	CAMFImporter_NodeElement_Color& als = *((CAMFImporter_NodeElement_Color*)ne);// alias for convenience

	als.Profile = profile;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool read_flag[4] = { false, false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("color");
			MACRO_NODECHECK_READCOMP_F("r", read_flag[0], als.Color.r);
			MACRO_NODECHECK_READCOMP_F("g", read_flag[1], als.Color.g);
			MACRO_NODECHECK_READCOMP_F("b", read_flag[2], als.Color.b);
			MACRO_NODECHECK_READCOMP_F("a", read_flag[3], als.Color.a);
		MACRO_NODECHECK_LOOPEND("color");
		ParseHelper_Node_Exit();
		// check that all components was defined
        if (!(read_flag[0] && read_flag[1] && read_flag[2])) {
            throw DeadlyImportError("Not all color components are defined.");
        }

        // check if <a> is absent. Then manually add "a == 1".
        if (!read_flag[3]) {
            als.Color.a = 1;
        }
	}
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}

	als.Composed = false;
	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}